

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

NucleusPtr __thiscall trento::Nucleus::create(Nucleus *this,string *species,double nucleon_dmin)

{
  bool bVar1;
  WoodsSaxonNucleus *this_00;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==(species,"p");
  if (bVar1) {
    this_00 = (WoodsSaxonNucleus *)operator_new(0x28);
    Proton::Proton((Proton *)this_00);
  }
  else {
    bVar1 = std::operator==(species,"d");
    if (bVar1) {
      this_00 = (WoodsSaxonNucleus *)operator_new(0x38);
      Deuteron::Deuteron((Deuteron *)this_00,0.457,2.35);
    }
    else {
      bVar1 = std::operator==(species,"Cu");
      if (bVar1) {
        this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
        WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0x3f,4.2,0.596,nucleon_dmin);
      }
      else {
        bVar1 = std::operator==(species,"Cu2");
        if (bVar1) {
          this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
          DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                    ((DeformedWoodsSaxonNucleus *)this_00,0x3f,4.2,0.596,0.162,-0.006,nucleon_dmin);
        }
        else {
          bVar1 = std::operator==(species,"Xe");
          if (bVar1) {
            this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
            WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0x81,5.36,0.59,nucleon_dmin);
          }
          else {
            bVar1 = std::operator==(species,"Xe2");
            if (bVar1) {
              this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
              DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                        ((DeformedWoodsSaxonNucleus *)this_00,0x81,5.36,0.59,0.162,-0.003,
                         nucleon_dmin);
            }
            else {
              bVar1 = std::operator==(species,"Au");
              if (bVar1) {
                this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
                WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0xc5,6.38,0.535,nucleon_dmin);
              }
              else {
                bVar1 = std::operator==(species,"Au2");
                if (bVar1) {
                  this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                  DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                            ((DeformedWoodsSaxonNucleus *)this_00,0xc5,6.38,0.535,-0.131,-0.031,
                             nucleon_dmin);
                }
                else {
                  bVar1 = std::operator==(species,"Pb");
                  if (bVar1) {
                    this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
                    WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0xd0,6.62,0.546,nucleon_dmin);
                  }
                  else {
                    bVar1 = std::operator==(species,"U");
                    if (bVar1) {
                      this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                      DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                ((DeformedWoodsSaxonNucleus *)this_00,0xee,6.81,0.6,0.28,0.093,
                                 nucleon_dmin);
                    }
                    else {
                      bVar1 = std::operator==(species,"U2");
                      if (bVar1) {
                        this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                        DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                  ((DeformedWoodsSaxonNucleus *)this_00,0xee,6.86,0.42,0.265,0.0,
                                   nucleon_dmin);
                      }
                      else {
                        bVar1 = std::operator==(species,"U3");
                        if (!bVar1) {
                          bVar1 = hdf5::filename_is_hdf5(species);
                          this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          if (bVar1) {
                            std::invalid_argument::invalid_argument
                                      (this_01,"HDF5 output was not compiled");
                            __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                                        std::invalid_argument::~invalid_argument);
                          }
                          std::operator+(&local_40,"unknown projectile species: ",species);
                          std::invalid_argument::invalid_argument(this_01,(string *)&local_40);
                          __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                        DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
                                  ((DeformedWoodsSaxonNucleus *)this_00,0xee,6.67,0.44,0.28,0.093,
                                   nucleon_dmin);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->_vptr_Nucleus = (_func_int **)this_00;
  return (__uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true>)
         (__uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true>)this;
}

Assistant:

NucleusPtr Nucleus::create(const std::string& species, double nucleon_dmin) {
  // W-S params ref. in header
  // XXX: remember to add new species to the help output in main() and the readme
  if (species == "p")
    return NucleusPtr{new Proton{}};
  else if (species == "d")
    return NucleusPtr{new Deuteron{}};
  else if (species == "Cu")
    return NucleusPtr{new WoodsSaxonNucleus{
       63, 4.20, 0.596, nucleon_dmin
    }};
  else if (species == "Cu2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
       63, 4.20, 0.596, 0.162, -0.006, nucleon_dmin
    }};
  else if (species == "Xe")
    return NucleusPtr{new WoodsSaxonNucleus{
      129, 5.36, 0.590, nucleon_dmin
    }};
  else if (species == "Xe2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      129, 5.36, 0.590, 0.162, -0.003, nucleon_dmin
    }};
  else if (species == "Au")
    return NucleusPtr{new WoodsSaxonNucleus{
      197, 6.38, 0.535, nucleon_dmin
    }};
  else if (species == "Au2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      197, 6.38, 0.535, -0.131, -0.031, nucleon_dmin
    }};
  else if (species == "Pb")
    return NucleusPtr{new WoodsSaxonNucleus{
      208, 6.62, 0.546, nucleon_dmin
    }};
  else if (species == "U")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.81, 0.600, 0.280, 0.093, nucleon_dmin
    }};
  else if (species == "U2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.86, 0.420, 0.265, 0.000, nucleon_dmin
    }};
  else if (species == "U3")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.67, 0.440, 0.280, 0.093, nucleon_dmin
    }};
  // Read nuclear configurations from HDF5.
  else if (hdf5::filename_is_hdf5(species)) {
#ifdef TRENTO_HDF5
    return ManualNucleus::create(species);
#else
    throw std::invalid_argument{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
  }
  else
    throw std::invalid_argument{"unknown projectile species: " + species};
}